

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

Promise<kj::Array<unsigned_int>_>
kj::joinPromises<unsigned_int>(Array<kj::Promise<unsigned_int>_> *promises,SourceLocation location)

{
  size_t count;
  Own<kj::_::ArrayJoinPromiseNode<unsigned_int>,_kj::_::PromiseDisposer> OVar1;
  long in_RSI;
  anon_class_1_0_00000001 local_61;
  Own<kj::_::ArrayJoinPromiseNode<unsigned_int>,_kj::_::PromiseDisposer> local_60;
  ArrayJoinBehavior local_54;
  Array<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_> local_50;
  Array<kj::_::ExceptionOr<unsigned_int>_> local_38;
  Mapper<kj::Array<kj::Promise<unsigned_int>_>_&> local_20;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_18;
  
  _::Mapper<kj::Array<kj::Promise<unsigned_int>_>_&>::
  operator*<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:1659:7)>
            (&local_50,&local_20,&local_61);
  count = *(size_t *)(in_RSI + 8);
  local_38.ptr = _::HeapArrayDisposer::allocate<kj::_::ExceptionOr<unsigned_int>>(count);
  local_38.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  local_54 = LAZY;
  local_38.size_ = count;
  _::PromiseDisposer::
  alloc<kj::_::ArrayJoinPromiseNode<unsigned_int>,kj::_::PromiseDisposer,kj::Array<kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>>,kj::Array<kj::_::ExceptionOr<unsigned_int>>,kj::SourceLocation&,kj::_::ArrayJoinBehavior>
            ((PromiseDisposer *)&local_60,&local_50,&local_38,&location,&local_54);
  OVar1.ptr = local_60.ptr;
  local_60.ptr = (ArrayJoinPromiseNode<unsigned_int> *)0x0;
  promises->ptr = (Promise<unsigned_int> *)OVar1.ptr;
  local_18.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_18);
  Own<kj::_::ArrayJoinPromiseNode<unsigned_int>,_kj::_::PromiseDisposer>::dispose(&local_60);
  Array<kj::_::ExceptionOr<unsigned_int>_>::~Array(&local_38);
  Array<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_>::~Array(&local_50);
  return (PromiseBase)(PromiseBase)promises;
}

Assistant:

Promise<Array<T>> joinPromises(Array<Promise<T>>&& promises, SourceLocation location) {
  return _::PromiseNode::to<Promise<Array<T>>>(_::allocPromise<_::ArrayJoinPromiseNode<T>>(
      KJ_MAP(p, promises) { return _::PromiseNode::from(kj::mv(p)); },
      heapArray<_::ExceptionOr<T>>(promises.size()), location,
      _::ArrayJoinBehavior::LAZY));
}